

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::updateTransitionMatrices
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  uint uVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  
  uVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar11 = (ulong)uVar1;
  uVar17 = uVar1 + 3;
  if (-1 < (int)uVar1) {
    uVar17 = uVar1;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar19 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
      uVar21 = 0;
      uVar11 = (ulong)uVar1;
      do {
        if (0 < (int)uVar19) {
          iVar14 = 0;
          pfVar3 = transitionMatrices[probabilityIndices[uVar21]];
          lVar13 = 0;
          do {
            if (0 < (int)uVar11) {
              lVar22 = 0;
              do {
                dVar23 = exp((double)(float)edgeLengths[uVar21] * categoryRates[lVar13] *
                             (double)(this->super_EigenDecomposition<float,_1>).gEigenValues
                                     [eigenIndex][lVar22]);
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar22] = (float)dVar23;
                lVar22 = lVar22 + 1;
                iVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar11 = (ulong)iVar2;
              } while (lVar22 < (long)uVar11);
              if (0 < iVar2) {
                iVar15 = 0;
                pfVar12 = this->gCMatrices[eigenIndex];
                do {
                  pfVar4 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  iVar16 = 0;
                  lVar22 = (long)iVar14;
                  do {
                    lVar18 = lVar22;
                    if ((int)uVar1 < 4) {
                      auVar26 = ZEXT864(0);
                      uVar19 = 0;
                    }
                    else {
                      auVar26 = ZEXT864(0);
                      uVar19 = 0;
                      do {
                        auVar27 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar19]),auVar26._0_16_,
                                                  ZEXT416((uint)pfVar4[uVar19]));
                        auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)pfVar12[uVar19 + 1]),
                                                  ZEXT416((uint)pfVar4[uVar19 + 1]));
                        auVar27 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar19 + 2]),auVar27,
                                                  ZEXT416((uint)pfVar4[uVar19 + 2]));
                        auVar27 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar19 + 3]),auVar27,
                                                  ZEXT416((uint)pfVar4[uVar19 + 3]));
                        auVar26 = ZEXT1664(auVar27);
                        uVar19 = uVar19 + 4;
                      } while ((long)uVar19 < (long)(int)(uVar17 & 0xfffffffc));
                    }
                    auVar27 = auVar26._0_16_;
                    if ((int)uVar19 < iVar2) {
                      uVar19 = uVar19 & 0xffffffff;
                      do {
                        auVar27 = vfmadd231ss_fma(auVar26._0_16_,ZEXT416((uint)pfVar12[uVar19]),
                                                  ZEXT416((uint)pfVar4[uVar19]));
                        auVar26 = ZEXT1664(auVar27);
                        uVar19 = uVar19 + 1;
                      } while (uVar11 != uVar19);
                    }
                    auVar27 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
                    pfVar12 = pfVar12 + uVar11;
                    iVar16 = iVar16 + 1;
                    pfVar3[lVar18] = auVar27._0_4_;
                    lVar22 = lVar18 + 1;
                  } while (iVar16 != iVar2);
                  iVar14 = (int)lVar18 + 2;
                  iVar15 = iVar15 + 1;
                  pfVar3[(int)(lVar18 + 1)] = 1.0;
                } while (iVar15 != iVar2);
              }
            }
            uVar19 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)uVar19);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar19 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
      uVar21 = 0;
      do {
        if (0 < (int)uVar19) {
          iVar14 = 0;
          pfVar3 = transitionMatrices[probabilityIndices[uVar21]];
          pfVar12 = transitionMatrices[firstDerivativeIndices[uVar21]];
          lVar13 = 0;
          do {
            if (0 < (int)uVar11) {
              lVar22 = 0;
              do {
                fVar9 = (float)categoryRates[lVar13] *
                        (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][lVar22];
                dVar23 = exp((double)(fVar9 * (float)edgeLengths[uVar21]));
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar22] = (float)dVar23;
                (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar22] =
                     (float)dVar23 * fVar9;
                lVar22 = lVar22 + 1;
                iVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar11 = (ulong)iVar2;
              } while (lVar22 < (long)uVar11);
              if (0 < iVar2) {
                iVar15 = 0;
                lVar22 = 0;
                do {
                  pfVar4 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  pfVar5 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
                  iVar16 = iVar2 + iVar14;
                  pfVar6 = this->gCMatrices[eigenIndex];
                  lVar18 = (long)iVar14;
                  do {
                    lVar20 = lVar18;
                    auVar25 = ZEXT816(0) << 0x40;
                    auVar27 = ZEXT816(0) << 0x40;
                    uVar19 = 0;
                    do {
                      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)pfVar6[(long)(int)lVar22 +
                                                                             uVar19]),
                                                ZEXT416((uint)pfVar4[uVar19]));
                      auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)pfVar6[(long)(int)lVar22 +
                                                                             uVar19]),
                                                ZEXT416((uint)pfVar5[uVar19]));
                      uVar19 = uVar19 + 1;
                    } while (uVar11 != uVar19);
                    auVar27 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
                    lVar22 = (long)(int)lVar22 + uVar11;
                    pfVar3[lVar20] = auVar27._0_4_;
                    pfVar12[lVar20] = auVar25._0_4_;
                    lVar18 = lVar20 + 1;
                  } while (iVar16 != (int)(lVar20 + 1));
                  iVar14 = (int)lVar20 + 2;
                  iVar15 = iVar15 + 1;
                  pfVar3[iVar16] = 1.0;
                  pfVar12[iVar16] = 0.0;
                } while (iVar15 != iVar2);
              }
            }
            uVar19 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)uVar19);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != (uint)count);
    }
  }
  else if (0 < count) {
    uVar19 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
    uVar21 = 0;
    do {
      if (0 < (int)uVar19) {
        iVar14 = 0;
        pfVar3 = transitionMatrices[probabilityIndices[uVar21]];
        pfVar12 = transitionMatrices[firstDerivativeIndices[uVar21]];
        pfVar4 = transitionMatrices[secondDerivativeIndices[uVar21]];
        lVar13 = 0;
        do {
          if (0 < (int)uVar11) {
            lVar22 = 0;
            do {
              fVar9 = (float)categoryRates[lVar13] *
                      (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][lVar22];
              dVar23 = exp((double)(fVar9 * (float)edgeLengths[uVar21]));
              (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar22] = (float)dVar23;
              fVar10 = fVar9 * (float)dVar23;
              (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar22] = fVar10;
              (this->super_EigenDecomposition<float,_1>).secondDerivTmp[lVar22] = fVar9 * fVar10;
              lVar22 = lVar22 + 1;
              iVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
              uVar11 = (ulong)iVar2;
            } while (lVar22 < (long)uVar11);
            if (0 < iVar2) {
              iVar15 = 0;
              lVar22 = 0;
              do {
                pfVar5 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                pfVar6 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
                pfVar7 = (this->super_EigenDecomposition<float,_1>).secondDerivTmp;
                iVar16 = iVar2 + iVar14;
                pfVar8 = this->gCMatrices[eigenIndex];
                lVar18 = (long)iVar14;
                do {
                  lVar20 = lVar18;
                  auVar24 = ZEXT816(0) << 0x40;
                  auVar25 = ZEXT816(0) << 0x40;
                  auVar27 = ZEXT816(0) << 0x40;
                  uVar19 = 0;
                  do {
                    fVar9 = pfVar8[(long)(int)lVar22 + uVar19];
                    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar9),
                                              ZEXT416((uint)pfVar5[uVar19]));
                    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar9),
                                              ZEXT416((uint)pfVar6[uVar19]));
                    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar9),
                                              ZEXT416((uint)pfVar7[uVar19]));
                    uVar19 = uVar19 + 1;
                  } while (uVar11 != uVar19);
                  auVar27 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
                  lVar22 = (long)(int)lVar22 + uVar11;
                  pfVar3[lVar20] = auVar27._0_4_;
                  pfVar12[lVar20] = auVar25._0_4_;
                  pfVar4[lVar20] = auVar24._0_4_;
                  lVar18 = lVar20 + 1;
                } while (iVar16 != (int)(lVar20 + 1));
                iVar14 = (int)lVar20 + 2;
                iVar15 = iVar15 + 1;
                pfVar3[iVar16] = 1.0;
                pfVar12[iVar16] = 0.0;
                pfVar4[iVar16] = 0.0;
              } while (iVar15 != iVar2);
            }
          }
          uVar19 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
          lVar13 = lVar13 + 1;
        } while (lVar13 < (long)uVar19);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}